

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt * __thiscall slang::SVInt::operator--(SVInt *this)

{
  uint64_t *dst;
  uint64_t *src;
  bool bVar1;
  uint32_t len;
  SVInt *this_local;
  
  bVar1 = isSingleWord(this);
  if (bVar1) {
    (this->super_SVIntStorage).field_0.pVal =
         (uint64_t *)((this->super_SVIntStorage).field_0.val - 1);
  }
  else if (((this->super_SVIntStorage).unknownFlag & 1U) == 0) {
    dst = (this->super_SVIntStorage).field_0.pVal;
    src = (this->super_SVIntStorage).field_0.pVal;
    len = getNumWords(this);
    subOne(dst,src,len,1);
  }
  else {
    setAllX(this);
  }
  clearUnusedBits(this);
  return this;
}

Assistant:

SVInt& SVInt::operator--() {
    if (isSingleWord())
        --val;
    else if (unknownFlag)
        setAllX();
    else
        subOne(pVal, pVal, getNumWords(), 1);
    clearUnusedBits();
    return *this;
}